

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper.c
# Opt level: O0

rxc_flow * rxc_flow_wrapper(_func_rxc_sink_ptr_rxc_sink_ptr_void_ptr *wrap,void *ctx)

{
  rxc_flow *prVar1;
  rxc_flow_wrapper *flow;
  void *ctx_local;
  _func_rxc_sink_ptr_rxc_sink_ptr_void_ptr *wrap_local;
  
  prVar1 = (rxc_flow *)malloc(0x28);
  prVar1[1].dealloc = (_func_void_rxc_flow_ptr_int *)ctx;
  prVar1[1].connect_source = (_func_rxc_source_ptr_rxc_flow_ptr_rxc_source_ptr *)wrap;
  prVar1->dealloc = flow_dealloc;
  prVar1->connect_source = flow_connect_source;
  prVar1->connect_sink = flow_connect_sink;
  return prVar1;
}

Assistant:

struct rxc_flow * rxc_flow_wrapper(struct rxc_sink * (*wrap)(struct rxc_sink *, void *),
                                   void *ctx)
{
    struct rxc_flow_wrapper *flow = malloc(sizeof(struct rxc_flow_wrapper));

    flow->ctx = ctx;
    flow->wrap = wrap;
    flow->base.dealloc = flow_dealloc;
    flow->base.connect_source = flow_connect_source;
    flow->base.connect_sink = flow_connect_sink;

    return &flow->base;
}